

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

size_t promptTextColumnLen(char *prompt,size_t plen)

{
  int iVar1;
  size_t sVar2;
  size_t local_1030;
  size_t len;
  size_t off;
  size_t buf_len;
  char buf [4096];
  size_t plen_local;
  char *prompt_local;
  
  off = 0;
  len = 0;
  buf._4088_8_ = plen;
  while (len < (ulong)buf._4088_8_) {
    iVar1 = isAnsiEscape(prompt + len,buf._4088_8_ - len,&local_1030);
    if (iVar1 == 0) {
      buf[off - 8] = prompt[len];
      len = len + 1;
      off = off + 1;
    }
    else {
      len = local_1030 + len;
    }
  }
  sVar2 = columnPos((char *)&buf_len,off,off);
  return sVar2;
}

Assistant:

static size_t promptTextColumnLen(const char *prompt, size_t plen) {
    char buf[LINENOISE_MAX_LINE];
    size_t buf_len = 0;
    size_t off = 0;
    while (off < plen) {
        size_t len;
        if (isAnsiEscape(prompt + off, plen - off, &len)) {
            off += len;
            continue;
        }
        buf[buf_len++] = prompt[off++];
    }
    return columnPos(buf,buf_len,buf_len);
}